

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall context::next(context *this)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = this->text;
  this->text = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 == '\t') {
    this->column = this->column + 4;
    return;
  }
  if (cVar1 == '\n') {
    this->line = this->line + 1;
    this->column = 0;
    return;
  }
  this->column = this->column + 1;
  return;
}

Assistant:

void context::next() noexcept
{
    const char character = text++[0];
    switch (character) {
    default:
        ++column;
        break;
    case '\t':
        column += 4;
        break;
    case '\n':
        ++line;
        column = 0;
        break;
    }
}